

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

shared_ptr<RandomForest::Node<double>_> __thiscall
RandomForest::Node<double>::GetRight(Node<double> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<RandomForest::Node<double>_> sVar1;
  
  std::__shared_ptr<RandomForest::Node<double>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<RandomForest::Node<double>,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<RandomForest::Node<double>,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x10)
            );
  sVar1.super___shared_ptr<RandomForest::Node<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<RandomForest::Node<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<RandomForest::Node<double>_>)
         sVar1.super___shared_ptr<RandomForest::Node<double>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<RandomForest::Node<T> > RandomForest::Node<T>::GetRight() const
{
    return right;
}